

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump2.cpp
# Opt level: O0

void __thiscall DumpParams::applyFormat(DumpParams *this,ostream *os)

{
  ostream *poVar1;
  bool bVar2;
  int *piVar3;
  uint64_t *puVar4;
  offset local_38;
  step local_30;
  int local_24;
  int local_20;
  summarize_threshold local_1c;
  ostream *local_18;
  ostream *os_local;
  DumpParams *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  if (this->dumpformat == 1) {
    std::ostream::operator<<(os,std::left);
  }
  else if (this->dumpformat == 2) {
    std::ostream::operator<<(os,std::right);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->summarizeThreshold);
  poVar1 = local_18;
  if (bVar2) {
    piVar3 = std::optional<int>::operator*(&this->summarizeThreshold);
    Hex::summarize_threshold::summarize_threshold(&local_1c,*piVar3);
    Hex::operator<<(poVar1,local_1c);
  }
  std::ostream::operator<<(local_18,std::showpoint);
  poVar1 = local_18;
  local_20 = (int)std::setw(this->unitsPerLine);
  std::operator<<(poVar1,(_Setw)local_20);
  poVar1 = local_18;
  local_24 = (int)std::setprecision(this->dumpUnitSize);
  std::operator<<(poVar1,(_Setprecision)local_24);
  std::ostream::operator<<(local_18,std::hex);
  poVar1 = local_18;
  Hex::step::step(&local_30,this->stepSize);
  Hex::operator<<(poVar1,local_30);
  if ((this->summarize & 1U) == 0) {
    std::ostream::operator<<(local_18,std::noskipws);
  }
  else {
    std::ostream::operator<<(local_18,std::skipws);
  }
  poVar1 = local_18;
  puVar4 = (uint64_t *)std::optional<long>::operator*(&this->offset);
  Hex::offset::offset(&local_38,*puVar4);
  Hex::operator<<(poVar1,local_38);
  return;
}

Assistant:

void applyFormat(std::ostream& os)
    {
        switch(dumpformat)
        {
            case DUMP_ASCII: os << std::right; break;
            case DUMP_HEX: os << std::left; break;
        }
        if (summarizeThreshold)
            os << Hex::summarize_threshold(*summarizeThreshold);
        
        os << std::showpoint;
        os << std::setw(unitsPerLine);
        os << std::setprecision(dumpUnitSize);
        os << std::hex;
        os << Hex::step(stepSize);
        if (summarize)
            os << std::skipws;
        else
            os << std::noskipws;
        os << Hex::offset(*offset);
    }